

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *this_00;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  long *plVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  undefined8 uVar10;
  size_type *psVar11;
  ulong *puVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  undefined7 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  bool bVar21;
  string a;
  string c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  string *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_64;
  string *local_60;
  Parg *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  _Base_ptr local_48;
  ulong local_40;
  _Base_ptr local_38;
  
  if (_argc < 1) {
    iVar14 = 1;
  }
  else {
    local_98 = &this->flags_;
    local_48 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->data_;
    local_90 = (string *)&this->error_;
    local_60 = &this->positional_;
    local_38 = &(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = 0;
    bVar21 = true;
    iVar14 = 0;
    local_64 = _argc;
    local_58 = this;
    local_50 = _argv;
    do {
      paVar20 = &local_d8.field_2;
      uVar15 = (ulong)iVar14;
      pbVar1 = (local_50->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_50->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar15)
      {
        pcVar17 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        goto LAB_0010a82a;
      }
      __rhs = pbVar1 + uVar15;
      iVar13 = iVar14;
      if ((local_40 & 1) == 0) {
        uVar15 = __rhs->_M_string_length;
        if (((uVar15 < 2) || (pcVar17 = (__rhs->_M_dataplus)._M_p, *pcVar17 != '-')) ||
           (pcVar17[1] == '-')) {
          if ((uVar15 < 3) || (pcVar17 = (__rhs->_M_dataplus)._M_p, *pcVar17 != '-')) {
LAB_00109e39:
            if ((uVar15 == 0) || (local_58->is_positional_ != true)) {
              unaff_R12 = &local_f8;
              std::operator+(unaff_R12,"no match for \'",__rhs);
              plVar7 = (long *)std::__cxx11::string::append((char *)unaff_R12);
              psVar11 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_d8.field_2._M_allocated_capacity = *psVar11;
                local_d8.field_2._8_8_ = plVar7[3];
                local_d8._M_dataplus._M_p = (pointer)paVar20;
              }
              else {
                local_d8.field_2._M_allocated_capacity = *psVar11;
                local_d8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_d8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=(local_90,(string *)&local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar20) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = true;
              goto LAB_0010a719;
            }
            uVar10 = std::__cxx11::string::compare((char *)__rhs);
            if ((int)uVar10 == 0) {
              local_40 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else if ((local_58->positional_)._M_string_length == 0) {
              std::__cxx11::string::_M_append((char *)local_60,(ulong)(__rhs->_M_dataplus)._M_p);
            }
            else {
              std::operator+(&local_d8," ",__rhs);
              std::__cxx11::string::_M_append((char *)local_60,(ulong)local_d8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar20) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            if (uVar15 < 2) goto LAB_0010a842;
            if (pcVar17[1] != '-') goto LAB_00109e39;
            pbVar18 = &local_d8;
            std::__cxx11::string::substr((ulong)pbVar18,(ulong)__rhs);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_allocated_capacity =
                 local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            lVar4 = std::__cxx11::string::find((char *)pbVar18,0x12b347,0);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)&local_b8,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (lVar4 + 3);
              std::__cxx11::string::substr((ulong)&local_b8,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                    ::find(&this_00->_M_t,&local_d8);
            if (iVar5._M_node == local_38) {
              std::operator+(&local_88,"invalid option \'",__rhs);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
LAB_0010a19b:
              puVar12 = (ulong *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_b8.field_2._M_allocated_capacity = *puVar12;
                local_b8.field_2._8_8_ = plVar7[3];
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *puVar12;
                local_b8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_b8._M_string_length = plVar7[1];
              *plVar7 = (long)puVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=(local_90,(string *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              iVar13 = iVar14;
            }
            else {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,&local_d8);
              if (pmVar6->seen_ == true) {
                std::operator+(&local_88,"option \'--",&local_d8);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
                goto LAB_0010a19b;
              }
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,&local_d8);
              if ((pmVar6->mode_ == true) && (local_f8._M_string_length == 0)) {
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_d8);
                std::__cxx11::string::_M_replace
                          ((ulong)&pmVar6->value_,0,(char *)(pmVar6->value_)._M_string_length,
                           0x12b25a);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_d8);
LAB_0010a40e:
                pmVar6->seen_ = true;
                uVar19 = (undefined7)((ulong)pbVar18 >> 8);
              }
              else {
                if (local_f8._M_string_length != 0) {
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_d8);
                  std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_d8);
                  goto LAB_0010a40e;
                }
                iVar13 = iVar14 + 1;
                if (local_64 <= iVar13) {
                  std::operator+(&local_88,"option \'--",&local_d8);
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
                  goto LAB_0010a19b;
                }
                uVar15 = (ulong)iVar13;
                if ((ulong)((long)(local_50->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_50->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar15)
                goto LAB_0010a861;
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_d8);
                std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_d8);
                pmVar6->seen_ = true;
                uVar19 = (undefined7)((uVar15 << 5) >> 8);
              }
              unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT71(uVar19,1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            bVar3 = true;
            iVar14 = iVar13;
            if ((char)unaff_R12 == '\0') goto LAB_0010a719;
          }
        }
        else {
          if (__rhs->_M_string_length < 2) goto LAB_0010a842;
          local_d8._M_string_length = 1;
          local_d8.field_2._M_local_buf[1] = 0;
          local_d8.field_2._M_local_buf[0] = (__rhs->_M_dataplus)._M_p[1];
          local_d8._M_dataplus._M_p = (pointer)paVar20;
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&local_98->_M_t,&local_d8);
          if (iVar8._M_node == local_48) {
LAB_0010a010:
            bVar3 = false;
            bVar2 = true;
            if (1 < __rhs->_M_string_length) {
              unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
              do {
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __rhs->_M_string_length <= unaff_R12) {
                  do {
                    std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,unaff_R12);
LAB_0010a842:
                    pcVar17 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
                    uVar15 = 1;
LAB_0010a82a:
                    std::__throw_out_of_range_fmt(pcVar17,uVar15);
                  } while( true );
                }
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                local_f8._M_string_length = 1;
                local_f8.field_2._M_local_buf[1] = 0;
                local_f8.field_2._M_local_buf[0] =
                     (__rhs->_M_dataplus)._M_p[(long)&(unaff_R12->_M_dataplus)._M_p];
                iVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(&local_98->_M_t,&local_f8);
                if (iVar8._M_node == local_48) {
LAB_0010a2f2:
                  std::operator+(&local_88,"invalid flag \'",__rhs);
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
LAB_0010a51c:
                  puVar12 = (ulong *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar12) {
                    local_b8.field_2._M_allocated_capacity = *puVar12;
                    local_b8.field_2._8_8_ = plVar7[3];
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                  }
                  else {
                    local_b8.field_2._M_allocated_capacity = *puVar12;
                    local_b8._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_b8._M_string_length = plVar7[1];
                  *plVar7 = (long)puVar12;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  std::__cxx11::string::operator=(local_90,(string *)&local_b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  uVar10 = local_f8.field_2._M_allocated_capacity;
                  _Var16._M_p = local_f8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0010a6e6;
                  goto LAB_0010a6ee;
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_f8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                if (pmVar6->mode_ != true) goto LAB_0010a2f2;
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_f8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                if (pmVar6->seen_ == true) {
                  std::operator+(&local_88,"flag \'-",&local_f8);
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
                  goto LAB_0010a51c;
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_f8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                std::__cxx11::string::_M_replace
                          ((ulong)&pmVar6->value_,0,(char *)(pmVar6->value_)._M_string_length,
                           0x12b25a);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_f8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                pmVar6->seen_ = true;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(unaff_R12->_M_dataplus)._M_p + 1);
              } while (unaff_R12 <
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __rhs->_M_string_length);
            }
          }
          else {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(local_98,&local_d8);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_00,pmVar9);
            if (pmVar6->mode_ != false) goto LAB_0010a010;
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(local_98,&local_d8);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(this_00,pmVar9);
            if (pmVar6->seen_ == true) {
              std::operator+(&local_b8,"flag \'-",&local_d8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
LAB_0010a665:
              puVar12 = (ulong *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_f8.field_2._M_allocated_capacity = *puVar12;
                local_f8.field_2._8_8_ = plVar7[3];
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              }
              else {
                local_f8.field_2._M_allocated_capacity = *puVar12;
                local_f8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_f8._M_string_length = plVar7[1];
              *plVar7 = (long)puVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=(local_90,(string *)&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar10 = local_b8.field_2._M_allocated_capacity;
              _Var16._M_p = local_b8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0010a6e6:
                operator_delete(_Var16._M_p,uVar10 + 1);
              }
LAB_0010a6ee:
              bVar3 = true;
              bVar2 = false;
            }
            else {
              if ((__rhs->_M_string_length < 3) || ((__rhs->_M_dataplus)._M_p[2] == '=')) {
                if ((__rhs->_M_string_length < 4) || ((__rhs->_M_dataplus)._M_p[2] != '=')) {
                  iVar13 = iVar14 + 1;
                  if (local_64 <= iVar13) {
                    std::operator+(&local_b8,"flag \'-",&local_d8);
                    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
                    goto LAB_0010a665;
                  }
                  uVar15 = (ulong)iVar13;
                  if ((ulong)((long)(local_50->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_50->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar15) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar15);
LAB_0010a861:
                    uVar10 = std::__throw_out_of_range_fmt
                                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                        ,uVar15);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                      operator_delete(local_f8._M_dataplus._M_p,
                                      local_f8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                      operator_delete(local_d8._M_dataplus._M_p,
                                      local_d8.field_2._M_allocated_capacity + 1);
                    }
                    _Unwind_Resume(uVar10);
                  }
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(local_98,&local_d8);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar9);
                  unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (uVar15 << 5);
                  std::__cxx11::string::_M_assign((string *)&pmVar6->value_);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(local_98,&local_d8);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar9);
                  pmVar6->seen_ = true;
                  bVar3 = false;
                  bVar2 = true;
                  iVar14 = iVar13;
                  goto LAB_0010a6f6;
                }
                std::__cxx11::string::substr((ulong)&local_f8,(ulong)__rhs);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_d8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                std::__cxx11::string::operator=((string *)&pmVar6->value_,(string *)&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_d8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
              }
              else {
                std::__cxx11::string::substr((ulong)&local_f8,(ulong)__rhs);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_d8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
                std::__cxx11::string::operator=((string *)&pmVar6->value_,(string *)&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(local_98,&local_d8);
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar9);
              }
              pmVar6->seen_ = true;
              bVar3 = false;
              bVar2 = true;
            }
          }
LAB_0010a6f6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          iVar13 = iVar14;
          if (!bVar2) goto LAB_0010a719;
        }
        bVar3 = false;
        iVar13 = iVar14;
      }
      else {
        if ((local_58->positional_)._M_string_length == 0) {
          std::__cxx11::string::_M_append((char *)local_60,(ulong)(__rhs->_M_dataplus)._M_p);
        }
        else {
          std::operator+(&local_d8," ",__rhs);
          std::__cxx11::string::_M_append((char *)local_60,(ulong)local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar20) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        bVar3 = false;
      }
LAB_0010a719:
      if (bVar3) break;
      iVar14 = iVar13 + 1;
      bVar21 = iVar14 < local_64;
    } while (iVar14 < local_64);
    iVar14 = -(uint)bVar21;
  }
  return iVar14;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<size_t>(i))};
      // std::cout << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        if (positional_.size() == 0)
        {
          positional_.append(tmp);
        }
        else
        {
          positional_.append(" " + tmp);
        }
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cout << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cout << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cout << "SHORT: mode -> " << c << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cout << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cout << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cout << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cout << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          if (positional_.size() == 0)
          {
            positional_.append(tmp);
          }
          else
          {
            positional_.append(" " + tmp);
          }
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        return -1;
      }
    }

    return 0;
  }